

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_test(char *infits,char *outfits,char *outfits2,fpstate fpvar)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  undefined8 *puVar5;
  int *in_RDI;
  undefined8 *puVar6;
  byte bVar7;
  double dVar8;
  char *unaff_retaddr;
  fitsfile **in_stack_00000008;
  imgstats imagestats;
  LONGLONG nrows;
  float xbits;
  float row_cpu;
  float row_elapse;
  float whole_elapse;
  float whole_cpu;
  float origdata;
  long dataend;
  long datastart;
  long headstart;
  double noisemin;
  double rescale;
  double bscale;
  char dimen [100];
  char dtype [8];
  int ncols;
  int bpix;
  int rescale_flag;
  int hdunum;
  int tstatus;
  int len;
  int extnum;
  int bitpix;
  int hdutype;
  int ii;
  int naxis;
  int totpix;
  int stat;
  long naxes [9];
  fitsfile *tempfile;
  fitsfile *outfptr2;
  fitsfile *outfptr;
  fitsfile *infptr;
  fitsfile *inputfptr;
  fitsfile *in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff754;
  fitsfile *in_stack_fffffffffffff758;
  fitsfile *in_stack_fffffffffffff760;
  fitsfile *in_stack_fffffffffffff768;
  long *in_stack_fffffffffffff770;
  fitsfile *in_stack_fffffffffffff778;
  int in_stack_fffffffffffff784;
  fitsfile *in_stack_fffffffffffff788;
  int *in_stack_fffffffffffff7a0;
  fitsfile *in_stack_fffffffffffff7a8;
  double in_stack_fffffffffffff7b0;
  long *in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7c4;
  undefined4 in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7cc;
  FILE *in_stack_fffffffffffff7d0;
  fitsfile *in_stack_fffffffffffff7d8;
  fitsfile *in_stack_fffffffffffff7e0;
  fitsfile *in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7f0 [1720];
  undefined1 auVar10 [1720];
  undefined1 auVar11 [1720];
  undefined1 auVar12 [1720];
  undefined1 auVar13 [1720];
  undefined1 auVar14 [1720];
  undefined1 auVar15 [1720];
  undefined1 auVar16 [1720];
  undefined1 auVar17 [1720];
  undefined1 auVar18 [1720];
  long local_158;
  long local_150;
  double local_140;
  double local_130;
  char local_128 [100];
  char local_c4 [8];
  uint local_bc;
  int local_b8;
  int local_b4;
  uint local_b0;
  int local_ac;
  int local_a8;
  uint local_a4;
  uint local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  fitsfile *local_88 [9];
  fitsfile *local_40;
  fitsfile *local_30;
  fitsfile *local_28;
  fitsfile *local_20;
  undefined1 auVar9 [1716];
  
  bVar7 = 0;
  auVar10._1616_104_ = in_stack_fffffffffffff7f0._1616_104_;
  auVar10._0_1608_ = in_stack_fffffffffffff7f0._0_1608_;
  auVar10._1608_8_ = &stack0x00000008;
  auVar9 = auVar10._0_1716_;
  memcpy(local_88,&DAT_0026cca0,0x48);
  local_8c = 0;
  local_90 = 0;
  local_94 = 0;
  local_a0 = 0;
  local_a4 = 0;
  local_ac = 0;
  auVar16._1716_4_ = 0;
  auVar16._0_1716_ = auVar9;
  ffopentest((int)in_stack_fffffffffffff760,(fitsfile **)in_stack_fffffffffffff758,
             (char *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
             (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int *)0x10907a);
  ffinit(in_stack_00000008,unaff_retaddr,in_RDI);
  ffinit(in_stack_00000008,unaff_retaddr,in_RDI);
  if (local_8c == 0) {
    while (local_8c == 0) {
      local_b4 = 0;
      ffghdt(in_stack_fffffffffffff758,
             (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
             &in_stack_fffffffffffff748->HDUposition);
      if (local_9c == 0) {
        ffgipr(in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20),
               &in_stack_fffffffffffff758->HDUposition,
               (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
               (long *)in_stack_fffffffffffff748,(int *)0x109160);
        local_90 = 1;
        for (local_98 = 0; local_98 < 9; local_98 = local_98 + 1) {
          local_90 = local_90 * (int)local_88[local_98];
        }
      }
      iVar2 = fits_is_compressed_image(in_stack_fffffffffffff748,(int *)0x1091cd);
      lVar4 = auVar16._1608_8_;
      if ((((iVar2 == 0) && (local_9c == 0)) && (local_94 != 0)) &&
         ((local_90 != 0 && (*(int *)(lVar4 + 0x7c) != 0)))) {
        if (((*(float *)(lVar4 + 0x18) != 0.0) || (NAN(*(float *)(lVar4 + 0x18)))) &&
           ((0 < (int)local_a0 && ((int)local_a0 < 0x40)))) {
          local_ac = 0;
          ffgky(in_stack_fffffffffffff788,in_stack_fffffffffffff784,
                (char *)in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                (char *)in_stack_fffffffffffff768,&in_stack_fffffffffffff760->HDUposition);
          if ((local_ac == 0) && ((local_130 != 1.0 || (NAN(local_130))))) {
            if (local_a0 == 0x20) {
              fp_i4stat(auVar16._328_8_,auVar16._324_4_,(long *)auVar16._312_8_,auVar16._304_8_,
                        auVar16._296_8_);
            }
            else {
              fp_i2stat(auVar16._336_8_,auVar16._332_4_,auVar16._320_8_,auVar16._312_8_,
                        &(auVar16._304_8_)->n_nulls);
            }
            local_140 = auVar16._1672_8_;
            dVar8 = auVar16._1664_8_;
            if (((dVar8 != 0.0) || (NAN(dVar8))) && (dVar8 < local_140)) {
              local_140 = dVar8;
            }
            dVar8 = auVar16._1680_8_;
            if (((dVar8 != 0.0) || (NAN(dVar8))) && (dVar8 < local_140)) {
              local_140 = dVar8;
            }
            local_140 = local_140 / (double)*(float *)(auVar16._1608_8_ + 0x18);
            if (1.0 < local_140) {
              fp_tmpnam((char *)in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758,
                        (char *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
              ffinit(in_stack_00000008,unaff_retaddr,in_RDI);
              ffghdn(local_20,(int *)&local_b0);
              if (local_b0 != 1) {
                ffcrim(in_stack_fffffffffffff778,(int)((ulong)in_stack_fffffffffffff770 >> 0x20),
                       (int)in_stack_fffffffffffff770,(long *)in_stack_fffffffffffff768,
                       &in_stack_fffffffffffff760->HDUposition);
              }
              ffcphd(in_stack_fffffffffffff7d8,(fitsfile *)in_stack_fffffffffffff7d0,
                     (int *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
              if (local_a0 == 0x20) {
                fp_i4rescale((fitsfile *)
                             CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                             in_stack_fffffffffffff7c4,in_stack_fffffffffffff7b8,
                             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                             in_stack_fffffffffffff7a0);
              }
              else {
                fp_i2rescale((fitsfile *)
                             CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                             in_stack_fffffffffffff7c4,in_stack_fffffffffffff7b8,
                             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                             in_stack_fffffffffffff7a0);
              }
              local_130 = local_130 * local_140;
              ffuky(in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                    (char *)in_stack_fffffffffffff758,
                    (void *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                    (char *)in_stack_fffffffffffff748,(int *)0x109541);
              ffrdef(auVar16._104_8_,auVar16._96_8_);
              local_28 = local_40;
              local_b4 = 1;
            }
          }
        }
        if (local_b4 == 0) {
          local_28 = local_20;
        }
        if (local_a0 == 8) {
          local_b8 = 8;
          strcpy(local_c4,"8  ");
          fp_i2stat(auVar16._336_8_,auVar16._332_4_,auVar16._320_8_,auVar16._312_8_,auVar16._304_8_)
          ;
        }
        else if (local_a0 == 0x10) {
          local_b8 = 0x10;
          strcpy(local_c4,"16 ");
          fp_i2stat(auVar16._336_8_,auVar16._332_4_,auVar16._320_8_,auVar16._312_8_,auVar16._304_8_)
          ;
        }
        else if (local_a0 == 0x20) {
          local_b8 = 0x20;
          strcpy(local_c4,"32 ");
          fp_i4stat(auVar16._328_8_,auVar16._324_4_,auVar16._312_8_,auVar16._304_8_,auVar16._296_8_)
          ;
        }
        else if (local_a0 == 0x40) {
          local_b8 = 0x40;
          strcpy(local_c4,"64 ");
        }
        else if (local_a0 == 0xffffffe0) {
          local_b8 = 0x20;
          strcpy(local_c4,"-32");
          fp_r4stat(auVar16._320_8_,auVar16._316_4_,auVar16._304_8_,auVar16._296_8_,auVar16._288_8_)
          ;
        }
        else if (local_a0 == 0xffffffc0) {
          local_b8 = 0x40;
          strcpy(local_c4,"-64");
          fp_r4stat(auVar16._320_8_,auVar16._316_4_,auVar16._304_8_,auVar16._296_8_,auVar16._288_8_)
          ;
        }
        local_140 = auVar16._1672_8_;
        dVar8 = auVar16._1664_8_;
        if (((dVar8 != 0.0) || (NAN(dVar8))) && (dVar8 < local_140)) {
          local_140 = dVar8;
        }
        dVar8 = auVar16._1680_8_;
        if (((dVar8 != 0.0) || (NAN(dVar8))) && (dVar8 < local_140)) {
          local_140 = dVar8;
        }
        dVar8 = log10(local_140);
        auVar11._1700_20_ = auVar16._1700_20_;
        auVar11._0_1696_ = auVar16._0_1696_;
        auVar11._1696_4_ = (float)(dVar8 / 0.301 + 1.792);
        printf("\n File: %s\n",in_RDI);
        printf(
              "  Ext BITPIX Dimens.   Nulls    Min    Max     Mean    Sigma  Noise2  Noise3  Noise5  Nbits   MaxR\n"
              );
        printf("  %3d  %s",(ulong)local_a4,local_c4);
        snprintf(local_128,100," (%ld",local_88[0]);
        sVar3 = strlen(local_128);
        local_a8 = (int)sVar3;
        for (local_98 = 1; auVar9 = auVar11._0_1716_, local_98 < local_94; local_98 = local_98 + 1)
        {
          if (local_a8 < 99) {
            snprintf(local_128 + local_a8,(long)(100 - local_a8),",%ld",local_88[local_98]);
          }
          sVar3 = strlen(local_128);
          local_a8 = (int)sVar3;
        }
        sVar3 = strlen(local_128);
        if (sVar3 < 99) {
          strcat(local_128,")");
        }
        printf("%-12s",local_128);
        ffghad(in_stack_fffffffffffff778,in_stack_fffffffffffff770,(long *)in_stack_fffffffffffff768
               ,(long *)in_stack_fffffffffffff760,&in_stack_fffffffffffff758->HDUposition);
        auVar14._1716_4_ = (float)((double)(local_158 - local_150) / 1000000.0);
        auVar14._0_1716_ = auVar9;
        fits_read_image_speed
                  (auVar9._312_8_,auVar9._304_8_,auVar9._296_8_,auVar9._288_8_,auVar9._280_8_,
                   auVar9._272_8_);
        in_stack_fffffffffffff748 = (fitsfile *)(double)((float)local_b8 / auVar14._1696_4_);
        printf(" %5d %6.0f %6.0f %8.1f %#8.2g %#7.3g %#7.3g %#7.3g %#5.1f %#6.2f\n",auVar14._1624_8_
               ,auVar14._1632_8_,auVar14._1640_8_,auVar14._1648_8_,auVar14._1664_8_,auVar14._1672_8_
               ,auVar14._1680_8_,(double)auVar14._1696_4_,(ulong)auVar14._1616_4_);
        printf(
              "\n       Type   Ratio       Size (MB)     Pk (Sec) UnPk Exact ElpN CPUN  Elp1  CPU1\n"
              );
        printf("       Native                                             %5.3f %5.3f %5.3f %5.3f\n"
               ,(double)auVar14._1708_4_,(double)auVar14._1712_4_,(double)auVar14._1704_4_,
               (double)auVar14._1700_4_);
        if (*(char *)(auVar14._1608_8_ + 0x494) != '\0') {
          in_stack_fffffffffffff750 = auVar14._1616_4_;
          in_stack_fffffffffffff758 = auVar14._1680_8_;
          in_stack_fffffffffffff760 = (fitsfile *)(double)auVar14._1708_4_;
          in_stack_fffffffffffff768 = (fitsfile *)(double)auVar14._1712_4_;
          in_stack_fffffffffffff770 = (long *)(double)auVar14._1704_4_;
          in_stack_fffffffffffff778 = (fitsfile *)(double)auVar14._1700_4_;
          in_stack_fffffffffffff748 = local_88[1];
          fprintf((FILE *)outreport,
                  " %s  %d %d %ld %ld %#10.4g %d %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g"
                  ,(double)auVar14._1716_4_,auVar14._1624_8_,auVar14._1632_8_,auVar14._1640_8_,
                  auVar14._1648_8_,auVar14._1656_8_,auVar14._1664_8_,auVar14._1672_8_,in_RDI,
                  (ulong)local_a4,(ulong)local_a0,local_88[0]);
        }
        fits_set_lossy_int(local_30,*(int *)(auVar14._1608_8_ + 0x20),&local_8c);
        if (((0 < (int)local_a0) && (lVar4 = auVar14._1608_8_, *(int *)(lVar4 + 0x20) != 0)) &&
           ((local_140 < (double)(*(float *)(lVar4 + 0x24) * *(float *)(lVar4 + 4)) ||
            (local_140 < (double)*(float *)(lVar4 + 0x28))))) {
          fits_set_lossy_int(local_30,0,&local_8c);
          ffghdn(local_28,(int *)&local_b0);
          printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n"
                 ,(ulong)local_b0);
        }
        fVar1 = *(float *)(auVar14._1608_8_ + 4);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fits_set_compression_type
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                     (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int *)0x109cfd);
          fits_set_tile_dim(in_stack_fffffffffffff768,
                            (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                            (long *)in_stack_fffffffffffff758,
                            (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
          iVar2 = (int)((ulong)in_stack_fffffffffffff748 >> 0x20);
          if (*(int *)(auVar14._1608_8_ + 8) == 0) {
            fits_set_quantize_method
                      ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                       iVar2,(int *)0x109d6d);
            auVar16 = auVar14;
          }
          else {
            fits_set_quantize_method
                      ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                       iVar2,(int *)0x109d4b);
            auVar16 = auVar14;
          }
          fits_set_quantize_level(local_30,*(float *)(auVar16._1608_8_ + 4),&local_8c);
          fits_set_dither_offset
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                     (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int *)0x109daf);
          fits_set_hcomp_scale(local_30,*(float *)(auVar16._1608_8_ + 0x14),&local_8c);
          fits_set_hcomp_smooth(local_30,*(int *)(auVar16._1608_8_ + 0x1c),&local_8c);
          auVar12._1608_112_ = auVar16._1608_112_;
          auVar12._0_1600_ = auVar16._0_1600_;
          auVar12._1600_8_ = local_28;
          auVar14._1600_120_ = auVar12._1600_120_;
          auVar14._0_1592_ = auVar16._0_1592_;
          auVar14._1592_8_ = local_30;
          puVar5 = auVar16._1608_8_;
          puVar6 = (undefined8 *)&stack0xfffffffffffff748;
          for (lVar4 = 0xd5; lVar4 != 0; lVar4 = lVar4 + -1) {
            *puVar6 = *puVar5;
            puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
            puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
          }
          fp_test_hdu(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
                      auVar14._16_1704_,&in_stack_fffffffffffff7d0->_flags);
        }
        fVar1 = *(float *)(auVar14._1608_8_ + 4);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fits_set_compression_type
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                     (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int *)0x109e7f);
          fits_set_tile_dim(in_stack_fffffffffffff768,
                            (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                            (long *)in_stack_fffffffffffff758,
                            (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
          iVar2 = (int)((ulong)in_stack_fffffffffffff748 >> 0x20);
          if (*(int *)(auVar14._1608_8_ + 8) == 0) {
            fits_set_quantize_method
                      ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                       iVar2,(int *)0x109eef);
            auVar16 = auVar14;
          }
          else {
            fits_set_quantize_method
                      ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                       iVar2,(int *)0x109ecd);
            auVar16 = auVar14;
          }
          fits_set_quantize_level(local_30,*(float *)(auVar16._1608_8_ + 4),&local_8c);
          fits_set_dither_offset
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                     (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int *)0x109f31);
          fits_set_hcomp_scale(local_30,*(float *)(auVar16._1608_8_ + 0x14),&local_8c);
          fits_set_hcomp_smooth(local_30,*(int *)(auVar16._1608_8_ + 0x1c),&local_8c);
          auVar13._1592_128_ = auVar16._1592_128_;
          auVar13._0_1584_ = auVar16._0_1584_;
          auVar13._1584_8_ = local_28;
          auVar14._1584_136_ = auVar13._1584_136_;
          auVar14._0_1576_ = auVar16._0_1576_;
          auVar14._1576_8_ = local_30;
          puVar5 = auVar16._1608_8_;
          puVar6 = (undefined8 *)&stack0xfffffffffffff748;
          for (lVar4 = 0xd5; lVar4 != 0; lVar4 = lVar4 + -1) {
            *puVar6 = *puVar5;
            puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
            puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
          }
          fp_test_hdu(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
                      auVar14._16_1704_,&in_stack_fffffffffffff7d0->_flags);
        }
        iVar2 = (int)((ulong)in_stack_fffffffffffff748 >> 0x20);
        if (*auVar14._1608_8_ == 0x16) {
          fits_set_compression_type
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),iVar2
                     ,(int *)0x109ff2);
        }
        else {
          fits_set_compression_type
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),iVar2
                     ,(int *)0x10a00e);
        }
        fits_set_tile_dim(in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                          (long *)in_stack_fffffffffffff758,
                          (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
        iVar2 = (int)((ulong)in_stack_fffffffffffff748 >> 0x20);
        if (*(int *)(auVar14._1608_8_ + 8) == 0) {
          fits_set_quantize_method
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),iVar2
                     ,(int *)0x10a07e);
        }
        else {
          fits_set_quantize_method
                    ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),iVar2
                     ,(int *)0x10a05c);
        }
        fits_set_quantize_level(local_30,*(float *)(auVar14._1608_8_ + 4),&local_8c);
        fits_set_dither_offset
                  ((fitsfile *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                   (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int *)0x10a0c0);
        fits_set_hcomp_scale(local_30,*(float *)(auVar14._1608_8_ + 0x14),&local_8c);
        fits_set_hcomp_smooth(local_30,*(int *)(auVar14._1608_8_ + 0x1c),&local_8c);
        auVar15._1576_144_ = auVar14._1576_144_;
        auVar15._0_1568_ = auVar14._0_1568_;
        auVar15._1568_8_ = local_28;
        auVar16._1568_152_ = auVar15._1568_152_;
        auVar16._0_1560_ = auVar14._0_1560_;
        auVar16._1560_8_ = local_30;
        puVar5 = auVar14._1608_8_;
        puVar6 = (undefined8 *)&stack0xfffffffffffff748;
        for (lVar4 = 0xd5; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar6 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        }
        fp_test_hdu(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
                    auVar16._16_1704_,&in_stack_fffffffffffff7d0->_flags);
        if (*(char *)(auVar16._1608_8_ + 0x494) != '\0') {
          fprintf((FILE *)outreport,"\n");
        }
        if (local_b4 != 0) {
          ffdelt(in_stack_fffffffffffff778,(int *)in_stack_fffffffffffff770);
          tempfilename3[0] = '\0';
        }
      }
      else if ((local_9c == 2) && (*(int *)(lVar4 + 0x80) != 0)) {
        ffgnrwll(in_stack_fffffffffffff758,
                 (LONGLONG *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                 &in_stack_fffffffffffff748->HDUposition);
        ffgncl(in_stack_fffffffffffff758,
               (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
               &in_stack_fffffffffffff748->HDUposition);
        printf("\n File: %s, HDU %d,  %d cols X %lld rows\n",in_RDI,(ulong)local_a4,(ulong)local_bc,
               auVar16._1688_8_);
        auVar17._1560_160_ = auVar16._1560_160_;
        auVar17._0_1552_ = auVar16._0_1552_;
        auVar17._1552_8_ = local_20;
        auVar18._1552_168_ = auVar17._1552_168_;
        auVar18._0_1544_ = auVar16._0_1544_;
        auVar18._1544_8_ = local_30;
        puVar5 = auVar16._1608_8_;
        puVar6 = (undefined8 *)&stack0xfffffffffffff748;
        auVar16 = auVar18;
        for (lVar4 = 0xd5; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar6 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        }
        fp_test_table(in_stack_fffffffffffff7d8,(fitsfile *)in_stack_fffffffffffff7d0,
                      (fitsfile *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                      auVar16._0_1704_,
                      (int *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
      }
      else {
        ffcopy(in_stack_fffffffffffff768,in_stack_fffffffffffff760,
               (int)((ulong)in_stack_fffffffffffff758 >> 0x20),
               (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
        ffcopy(in_stack_fffffffffffff768,in_stack_fffffffffffff760,
               (int)((ulong)in_stack_fffffffffffff758 >> 0x20),
               (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
      }
      ffmrhd(in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20),
             &in_stack_fffffffffffff758->HDUposition,
             (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
      local_a4 = local_a4 + 1;
    }
    if (local_8c == 0x6b) {
      local_8c = 0;
    }
    ffclos(in_stack_fffffffffffff758,
           (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
    ffclos(in_stack_fffffffffffff758,
           (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
    ffclos(in_stack_fffffffffffff758,
           (int *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
    if (local_8c != 0) {
      ffrprt(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc);
    }
    return 0;
  }
  ffrprt(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc);
  exit(local_8c);
}

Assistant:

int fp_test (char *infits, char *outfits, char *outfits2, fpstate fpvar)
{
	fitsfile *inputfptr, *infptr, *outfptr, *outfptr2, *tempfile;

	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	int	stat=0, totpix=0, naxis=0, ii, hdutype, bitpix = 0, extnum = 0, len;
	int     tstatus = 0, hdunum, rescale_flag, bpix, ncols;
	char	dtype[8], dimen[100];
	double  bscale, rescale, noisemin;
	long headstart, datastart, dataend;
	float origdata = 0., whole_cpu, whole_elapse, row_elapse, row_cpu, xbits;

	LONGLONG nrows;
	/* structure to hold image statistics (defined in fpack.h) */
	imgstats imagestats;

	fits_open_file (&inputfptr, infits, READONLY, &stat);
	fits_create_file (&outfptr, outfits, &stat);
	fits_create_file (&outfptr2, outfits2, &stat);

	if (stat) { fits_report_error (stderr, stat); exit (stat); }

	while (! stat) {
	    
	    /*  LOOP OVER EACH HDU */
	    rescale_flag = 0;
	    fits_get_hdu_type (inputfptr, &hdutype, &stat);

	    if (hdutype == IMAGE_HDU) {
	        fits_get_img_param (inputfptr, 9, &bitpix, &naxis, naxes, &stat);
	        for (totpix=1, ii=0; ii < 9; ii++) totpix *= naxes[ii];
	    }

	    if (!fits_is_compressed_image (inputfptr,  &stat) && hdutype == IMAGE_HDU &&
		naxis != 0 && totpix != 0 && fpvar.do_images) {

		/* rescale a scaled integer image to reduce noise? */
		if (fpvar.rescale_noise != 0. && bitpix > 0 && bitpix < LONGLONG_IMG) {

		   tstatus = 0;
		   fits_read_key(inputfptr, TDOUBLE, "BSCALE", &bscale, 0, &tstatus);

		   if (tstatus == 0 && bscale != 1.0) {  /* image must be scaled */

			if (bitpix == LONG_IMG)
			  fp_i4stat(inputfptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(inputfptr, naxis, naxes, &imagestats, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			rescale = noisemin / fpvar.rescale_noise;
			if (rescale > 1.0) {
			  
			  /* all the criteria are met, so create a temporary file that */
			  /* contains a rescaled version of the image, in CWD */
			  
                	  /* create temporary file name */
			  fp_tmpnam("Tmpfile3", "", tempfilename3);

			  fits_create_file(&tempfile, tempfilename3, &stat);

			  fits_get_hdu_num(inputfptr, &hdunum);
			  if (hdunum != 1) {

			     /* the input hdu is an image extension, so create dummy primary */
			     fits_create_img(tempfile, 8, 0, naxes, &stat);
			  }

			  fits_copy_header(inputfptr, tempfile, &stat); /* copy the header */
			  
			  /* rescale the data, so that it will compress more efficiently */
			  if (bitpix == LONG_IMG)
			    fp_i4rescale(inputfptr, naxis, naxes, rescale, tempfile, &stat);
			  else
			    fp_i2rescale(inputfptr, naxis, naxes, rescale, tempfile, &stat);

			  /* scale the BSCALE keyword by the inverse factor */

			  bscale = bscale * rescale;  
			  fits_update_key(tempfile, TDOUBLE, "BSCALE", &bscale, 0, &stat);

			  /* rescan the header, to reset the actual scaling parameters */
			  fits_set_hdustruc(tempfile, &stat);

			  infptr = tempfile;
			  rescale_flag = 1;
			}
		   }
		 }

		if (!rescale_flag)   /* just compress the input file, without rescaling */
		   infptr = inputfptr;

		/* compute basic statistics about the input image */
                if (bitpix == BYTE_IMG) {
		   bpix = 8;
		   strcpy(dtype, "8  ");
		   fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == SHORT_IMG) {
		   bpix = 16;
		   strcpy(dtype, "16 ");
		   fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == LONG_IMG) {
		   bpix = 32;
		   strcpy(dtype, "32 ");
		   fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == LONGLONG_IMG) {
		   bpix = 64;
		   strcpy(dtype, "64 ");
		} else if (bitpix == FLOAT_IMG)   {
		   bpix = 32;
		   strcpy(dtype, "-32");
		   fp_r4stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == DOUBLE_IMG)  {
		   bpix = 64;
		   strcpy(dtype, "-64");
		   fp_r4stat(infptr, naxis, naxes, &imagestats, &stat);
		}

		/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
		noisemin = imagestats.noise3;
		if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
		if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

                xbits = (float) (log10(noisemin)/.301 + 1.792);

		printf("\n File: %s\n", infits);
		printf("  Ext BITPIX Dimens.   Nulls    Min    Max     Mean    Sigma  Noise2  Noise3  Noise5  Nbits   MaxR\n");

		printf("  %3d  %s", extnum, dtype);
		snprintf(dimen,100," (%ld", naxes[0]);
		len =strlen(dimen);
		for (ii = 1; ii < naxis; ii++) {
                    if (len < 99)
		       snprintf(dimen+len,100-len,",%ld", naxes[ii]);
		    len =strlen(dimen);
		}
                if (strlen(dimen)<99)
		   strcat(dimen, ")");
		printf("%-12s",dimen);

		fits_get_hduaddr(inputfptr, &headstart, &datastart, &dataend, &stat);
		origdata = (float) ((dataend - datastart)/1000000.);

		/* get elapsed and cpu times need to read the uncompressed image */
		fits_read_image_speed (infptr, &whole_elapse, &whole_cpu,
		               &row_elapse, &row_cpu, &stat);

		printf(" %5d %6.0f %6.0f %8.1f %#8.2g %#7.3g %#7.3g %#7.3g %#5.1f %#6.2f\n",
		        imagestats.n_nulls, imagestats.minval, imagestats.maxval, 
		      imagestats.mean, imagestats.sigma, 
		      imagestats.noise2, imagestats.noise3, imagestats.noise5, xbits, bpix/xbits);

		printf("\n       Type   Ratio       Size (MB)     Pk (Sec) UnPk Exact ElpN CPUN  Elp1  CPU1\n");

		printf("       Native                                             %5.3f %5.3f %5.3f %5.3f\n",
		        whole_elapse, whole_cpu, row_elapse, row_cpu);

		if (fpvar.outfile[0]) {
		    fprintf(outreport,
	" %s  %d %d %ld %ld %#10.4g %d %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g",
		      infits, extnum, bitpix, naxes[0], naxes[1], origdata, imagestats.n_nulls, imagestats.minval, 
		      imagestats.maxval, imagestats.mean, imagestats.sigma, 
		      imagestats.noise1, imagestats.noise2, imagestats.noise3, imagestats.noise5, whole_elapse, whole_cpu, row_elapse, row_cpu);
		}

		fits_set_lossy_int (outfptr, fpvar.int_to_float, &stat);
		if ( (bitpix > 0) && (fpvar.int_to_float != 0) ) {

			if ( (noisemin < (fpvar.n3ratio * fpvar.quantize_level) ) ||
			    (noisemin < fpvar.n3min)) {
			
			    /* image contains too little noise to quantize effectively */
			    fits_set_lossy_int (outfptr, 0, &stat);
			    fits_get_hdu_num(infptr, &hdunum);

printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n", hdunum);
			} 
		}

		/* test compression ratio and speed for each algorithm */

		if (fpvar.quantize_level != 0) {

		  fits_set_compression_type (outfptr, RICE_1, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		  if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		  else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		  fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		  fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		  fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		  fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
		}

		if (fpvar.quantize_level != 0) {
\
  		  fits_set_compression_type (outfptr, HCOMPRESS_1, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

		  if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		  else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		  fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		  fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		  fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		  fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
		}

		if (fpvar.comptype == GZIP_2) {
		    fits_set_compression_type (outfptr, GZIP_2, &stat);
		} else {
		    fits_set_compression_type (outfptr, GZIP_1, &stat);
		}

		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

		if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);

/*
		fits_set_compression_type (outfptr, BZIP2_1, &stat);
		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
*/
/*
		fits_set_compression_type (outfptr, PLIO_1, &stat);
		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
*/
/*
                if (bitpix == SHORT_IMG || bitpix == LONG_IMG) {
		  fits_set_compression_type (outfptr, NOCOMPRESS, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);	  
		}
*/
		if (fpvar.outfile[0])
		    fprintf(outreport,"\n");

		/* delete the temporary file */
		if (rescale_flag)  { 
		    fits_delete_file (infptr, &stat);
		    tempfilename3[0] = '\0';   /* clear the temp filename */ 
                }
	    } else if ( (hdutype == BINARY_TBL) && fpvar.do_tables) {

    		fits_get_num_rowsll(inputfptr, &nrows, &stat);
    		fits_get_num_cols(inputfptr, &ncols, &stat);
#if defined(_MSC_VER)
                /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
 		printf("\n File: %s, HDU %d,  %d cols X %I64d rows\n", infits, extnum, ncols, nrows);
#elif (USE_LL_SUFFIX == 1)
 		printf("\n File: %s, HDU %d,  %d cols X %lld rows\n", infits, extnum, ncols, nrows);
#else
 		printf("\n File: %s, HDU %d,  %d cols X %ld rows\n", infits, extnum, ncols, nrows);
#endif
		fp_test_table(inputfptr, outfptr, outfptr2, fpvar, &stat);	  

	    } else {
		fits_copy_hdu (inputfptr, outfptr, 0, &stat);
		fits_copy_hdu (inputfptr, outfptr2, 0, &stat);
	    }

	    fits_movrel_hdu (inputfptr, 1, NULL, &stat);
            extnum++;
	}


	if (stat == END_OF_FILE) stat = 0;

	fits_close_file (outfptr2, &stat);
	fits_close_file (outfptr, &stat);
	fits_close_file (inputfptr, &stat);

	if (stat) {
	  fits_report_error (stderr, stat);
	}
	return(0);
}